

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O2

void headerJSON(FILE *stream,per_transfer *per)

{
  ulong uVar1;
  int iVar2;
  size_t a;
  char *in;
  curl_header *pcVar3;
  ulong uVar4;
  curl_header *header;
  char *local_38;
  
  fputc(0x7b,(FILE *)stream);
  pcVar3 = (curl_header *)0x0;
  do {
    do {
      while( true ) {
        header = (curl_header *)curl_easy_nextheader(per->curl,1,0xffffffff,pcVar3);
        if (header == (curl_header *)0x0) {
          fputs("\n}",(FILE *)stream);
          return;
        }
        uVar1 = header->amount;
        if (1 < uVar1) break;
        if (pcVar3 != (curl_header *)0x0) {
          fputs(",\n",(FILE *)stream);
        }
        jsonWriteString(stream,header->name,true);
        fputc(0x3a,(FILE *)stream);
        fputc(0x5b,(FILE *)stream);
        jsonWriteString(stream,header->value,false);
        fputc(0x5d,(FILE *)stream);
        pcVar3 = header;
      }
    } while (header->index != 0);
    in = header->name;
    local_38 = in;
    if (pcVar3 != (curl_header *)0x0) {
      fputs(",\n",(FILE *)stream);
      in = header->name;
    }
    jsonWriteString(stream,in,true);
    fputc(0x3a,(FILE *)stream);
    pcVar3 = header;
    fputc(0x5b,(FILE *)stream);
    uVar4 = 1;
    do {
      jsonWriteString(stream,header->value,false);
      if (uVar1 <= uVar4) break;
      fputc(0x2c,(FILE *)stream);
      iVar2 = curl_easy_header(per->curl,local_38,uVar4,1,0xffffffffffffffff,&header);
      uVar4 = uVar4 + 1;
    } while (iVar2 == 0);
    fputc(0x5d,(FILE *)stream);
  } while( true );
}

Assistant:

void headerJSON(FILE *stream, struct per_transfer *per)
{
  struct curl_header *header;
  struct curl_header *prev = NULL;

  fputc('{', stream);
  while((header = curl_easy_nextheader(per->curl, CURLH_HEADER, -1,
                                       prev)) != NULL) {
    if(header->amount > 1) {
      if(!header->index) {
        /* act on the 0-index entry and pull the others in, then output in a
           JSON list */
        size_t a = header->amount;
        size_t i = 0;
        char *name = header->name;
        if(prev)
          fputs(",\n", stream);
        jsonWriteString(stream, header->name, TRUE);
        fputc(':', stream);
        prev = header;
        fputc('[', stream);
        do {
          jsonWriteString(stream, header->value, FALSE);
          if(++i >= a)
            break;
          fputc(',', stream);
          if(curl_easy_header(per->curl, name, i, CURLH_HEADER,
                              -1, &header))
            break;
        } while(1);
        fputc(']', stream);
      }
    }
    else {
      if(prev)
        fputs(",\n", stream);
      jsonWriteString(stream, header->name, TRUE);
      fputc(':', stream);
      fputc('[', stream);
      jsonWriteString(stream, header->value, FALSE);
      fputc(']', stream);
      prev = header;
    }
  }
  fputs("\n}", stream);
}